

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O3

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,2ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,2ul>>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  bool bVar1;
  bool bVar2;
  undefined8 *puVar3;
  node_type *pnVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  node_type *pnVar9;
  float fVar10;
  scalar_type split_val;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,2ul>>
  *local_60;
  size_type split_dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> split;
  box_type right;
  
  lVar6 = *(long *)(this + 0x20);
  lVar5 = *(long *)(lVar6 + 0x10);
  if (lVar5 == 0x100) {
    puVar3 = (undefined8 *)operator_new(0x2008);
    *puVar3 = *(undefined8 *)(lVar6 + 8);
    *(undefined8 **)(lVar6 + 8) = puVar3;
    puVar3 = puVar3 + 1;
    *(undefined8 **)(lVar6 + 0x18) = puVar3;
    lVar5 = 0;
  }
  else {
    puVar3 = *(undefined8 **)(lVar6 + 0x18);
  }
  pnVar9 = (node_type *)(puVar3 + lVar5 * 4);
  *(long *)(lVar6 + 0x10) = lVar5 + 1;
  if ((long)*(int *)(this + 8) < (long)end._M_current - (long)begin._M_current >> 2) {
    split._M_current = (int *)0x0;
    local_60 = this;
    splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
    ::operator()((splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  *)(this + 0x10),depth,begin,end,box,&split,&split_dim,&split_val);
    right.storage_.coords_min._M_elems = *&(box->storage_).coords_min._M_elems;
    right.storage_.coords_max._M_elems = *&(box->storage_).coords_max._M_elems;
    (box->storage_).coords_max._M_elems[split_dim] = split_val;
    right.storage_.coords_min._M_elems[split_dim] = split_val;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (local_60,depth + 1,begin,split,box);
    (pnVar9->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).left
         = pnVar4;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (local_60,depth + 1,split,end,&right);
    (pnVar9->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).
    right = pnVar4;
    (pnVar9->data).branch.split_dim = (int)split_dim;
    (pnVar9->data).branch.left_max = (box->storage_).coords_max._M_elems[split_dim];
    (pnVar9->data).branch.right_min = right.storage_.coords_min._M_elems[split_dim];
    lVar6 = 0;
    pfVar8 = (float *)&right;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      if (*pfVar8 < (box->storage_).coords_min._M_elems[lVar6]) {
        (box->storage_).coords_min._M_elems[lVar6] = *pfVar8;
      }
      fVar10 = right.storage_.coords_max._M_elems[lVar6];
      pfVar8 = (box->storage_).coords_max._M_elems + lVar6;
      if (*pfVar8 <= fVar10 && fVar10 != *pfVar8) {
        (box->storage_).coords_max._M_elems[lVar6] = fVar10;
      }
      lVar6 = 1;
      pfVar8 = right.storage_.coords_min._M_elems + 1;
      bVar1 = false;
    } while (bVar2);
  }
  else {
    lVar6 = **(long **)(this + 0x18);
    (pnVar9->data).branch.split_dim = (int)((ulong)((long)begin._M_current - lVar6) >> 2);
    (pnVar9->data).leaf.end_idx = (int)((ulong)((long)end._M_current - lVar6) >> 2);
    (pnVar9->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).left
         = (kd_tree_node_euclidean<int,_float> *)0x0;
    (pnVar9->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).
    right = (kd_tree_node_euclidean<int,_float> *)0x0;
    *(undefined8 *)(box->storage_).coords_min._M_elems = 0x7f7fffff7f7fffff;
    *(undefined8 *)(box->storage_).coords_max._M_elems = 0xff7fffffff7fffff;
    if (begin._M_current < end._M_current) {
      lVar6 = *(long *)**(undefined8 **)this;
      do {
        lVar5 = lVar6 + (long)*begin._M_current * 8;
        lVar7 = 0;
        bVar1 = true;
        do {
          bVar2 = bVar1;
          fVar10 = *(float *)(lVar5 + lVar7 * 4);
          if (fVar10 < (box->storage_).coords_min._M_elems[lVar7]) {
            (box->storage_).coords_min._M_elems[lVar7] = fVar10;
            fVar10 = *(float *)(lVar5 + lVar7 * 4);
          }
          pfVar8 = (box->storage_).coords_max._M_elems + lVar7;
          if (*pfVar8 <= fVar10 && fVar10 != *pfVar8) {
            (box->storage_).coords_max._M_elems[lVar7] = fVar10;
          }
          lVar7 = 1;
          bVar1 = false;
        } while (bVar2);
        begin._M_current = begin._M_current + 1;
      } while (begin._M_current < end._M_current);
    }
  }
  return pnVar9;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }